

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

bool __thiscall HModel::allNonbasicMoveVsWorkArrays_OK(HModel *this)

{
  int iVar1;
  bool bVar2;
  int var;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    iVar1 = this->numTot;
    if ((long)iVar1 <= (long)uVar3) {
LAB_0012fdc4:
      return (long)iVar1 <= (long)uVar3;
    }
    printf("NonbasicMoveVsWorkArrays: var = %2d; nonbasicFlag[var] = %2d\n",uVar3 & 0xffffffff,
           (ulong)(uint)(this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3]);
    if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] != 0) {
      bVar2 = oneNonbasicMoveVsWorkArrays_OK(this,(int)uVar3);
      if (!bVar2) {
        printf("Error in NonbasicMoveVsWorkArrays for nonbasic variable %d\n",uVar3 & 0xffffffff);
        std::ostream::flush();
        goto LAB_0012fdc4;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

bool HModel::allNonbasicMoveVsWorkArrays_OK() {
  bool ok;
  for (int var = 0; var < numTot; ++var) {
    printf("NonbasicMoveVsWorkArrays: var = %2d; nonbasicFlag[var] = %2d\n", var, nonbasicFlag[var]);
    if (!nonbasicFlag[var]) continue;
    ok = oneNonbasicMoveVsWorkArrays_OK(var);
    if (!ok) {
      printf("Error in NonbasicMoveVsWorkArrays for nonbasic variable %d\n", var);cout << flush;
#ifdef JAJH_dev
      assert(ok);
#endif
      return ok;
    }
  }
  //ok must be true if we reach here
  assert(ok);
  return ok;
}